

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransArray.h
# Opt level: O3

void __thiscall TransArray::flushbuf(TransArray *this,int fd,int use_seq,int pos)

{
  long *plVar1;
  ulong uVar2;
  runtime_error *this_00;
  long lVar3;
  
  lseek(fd,(this->offset).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start[pos] << 2,0);
  lVar3 = (long)this->theSize;
  if (0 < lVar3) {
    uVar2 = write(fd,(this->theArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,lVar3 * 4);
    if (uVar2 < (ulong)(lVar3 * 4)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Error writing");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar1 = (this->offset).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start + pos;
    *plVar1 = *plVar1 + lVar3;
  }
  this->theSize = 0;
  return;
}

Assistant:

void flushbuf(int fd, int use_seq, int pos = 0) {
        lseek(fd, offset[pos] * sizeof(int), SEEK_SET);
        int wblk = theSize;
        if (wblk > 0) {
            auto res = write(fd, (char *) theArray.data(), wblk * sizeof(int));
            if (res < wblk * sizeof(int)) {
                throw runtime_error("Error writing");
            }
            offset[pos] += wblk;
        }
        theSize = 0;
    }